

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
mxx::impl::get_displacements<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *counts)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,counts);
  iVar3 = 0;
  for (piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    iVar1 = *piVar2;
    if (0x7ffffffe < (ulong)((long)iVar3 + (long)iVar1)) {
      assert_fail("(std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
                  ,0x3a,"get_displacements");
      iVar1 = *piVar2;
    }
    *piVar2 = iVar3;
    iVar3 = iVar1 + iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> get_displacements(const std::vector<index_t>& counts)
{
    // copy and do an exclusive prefix sum
    std::vector<index_t> result(counts);
    // set the total sum to zero
    index_t sum = 0;
    index_t tmp;

    // calculate the exclusive prefix sum
    typename std::vector<index_t>::iterator begin = result.begin();
    while (begin != result.end())
    {
        tmp = sum;
        // assert that the sum will still fit into the index type (MPI default:
        // int)
        MXX_ASSERT((std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max());
        sum += *begin;
        *begin = tmp;
        ++begin;
    }
    return result;
}